

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

_Bool check_frame(cio_websocket_frame_type opcode,char *payload,size_t payload_length,
                 _Bool is_last_frame)

{
  size_t sVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  undefined8 in_RAX;
  uint uVar5;
  size_t sVar7;
  uint8_t mask [4];
  undefined8 uStack_28;
  ulong uVar6;
  
  sVar1 = write_buffer_parse_pos + 1;
  bVar2 = write_buffer[write_buffer_parse_pos];
  if ((((opcode & ~(uint)bVar2) == CIO_WEBSOCKET_CONTINUATION_FRAME) &&
      (-1 < (char)bVar2 != is_last_frame)) && ((bVar2 & 0x70) == 0)) {
    sVar7 = write_buffer_parse_pos + 2;
    lVar3 = write_buffer_parse_pos + 1;
    uVar5 = write_buffer[lVar3] & 0x7f;
    uVar6 = (ulong)uVar5;
    if (uVar6 == 0x7f) {
      uVar6 = *(ulong *)(write_buffer + write_buffer_parse_pos + 2);
      sVar7 = write_buffer_parse_pos + 10;
    }
    else if (uVar5 == 0x7e) {
      uVar6 = (ulong)*(ushort *)(write_buffer + write_buffer_parse_pos + 2);
      sVar7 = write_buffer_parse_pos + 4;
    }
    sVar1 = sVar7;
    if (uVar6 == payload_length) {
      write_buffer_parse_pos = sVar7;
      uStack_28 = in_RAX;
      if ((char)write_buffer[lVar3] < '\0') {
        lVar3 = sVar7 + 4;
        uStack_28 = CONCAT44(*(undefined4 *)(write_buffer + sVar7),(int)in_RAX);
        sVar7 = sVar7 + 4;
        write_buffer_parse_pos = sVar7;
        cio_websocket_mask(write_buffer + lVar3,payload_length,(uint8_t *)((long)&uStack_28 + 4));
      }
      if ((payload_length == 0) ||
         (iVar4 = bcmp(write_buffer + sVar7,payload,payload_length), sVar1 = write_buffer_parse_pos,
         iVar4 == 0)) {
        write_buffer_parse_pos = sVar7 + payload_length;
        return true;
      }
    }
  }
  write_buffer_parse_pos = sVar1;
  return false;
}

Assistant:

static bool check_frame(enum cio_websocket_frame_type opcode, const char *payload, size_t payload_length, bool is_last_frame)
{
	uint8_t header = write_buffer[write_buffer_parse_pos++];
	if (((header & WS_HEADER_FIN) == WS_HEADER_FIN) != is_last_frame) {
		return false;
	}

	if ((header & WS_HEADER_RSV) != 0) {
		return false;
	}

	if ((header & opcode) != opcode) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;

	uint64_t length;
	if (first_length == 126) {
		uint16_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be16toh(len);
		length = len;
	} else if (first_length == 127) {
		uint64_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be64toh(len);
		length = len;
	} else {
		length = first_length;
	}

	if (length != payload_length) {
		return false;
	}

	if (is_masked) {
		uint8_t mask[4];
		memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
		write_buffer_parse_pos += sizeof(mask);
		cio_websocket_mask(&write_buffer[write_buffer_parse_pos], (size_t)length, mask);
	}

	if (length > SIZE_MAX) {
		return false;
	}

	if (length > 0) {
		if (memcmp(&write_buffer[write_buffer_parse_pos], payload, (size_t)length) != 0) {
			return false;
		}
	}

	write_buffer_parse_pos += payload_length;

	return true;
}